

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

bool GetLogCategory(LogFlags *flag,string_view str)

{
  long lVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar2;
  pointer ppVar3;
  char *in_RSI;
  _Self *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_stack_ffffffffffffff78);
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff98,
               (char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    __x._M_str = in_stack_ffffffffffffffb8;
    __x._M_len = in_stack_ffffffffffffffb0;
    __y._M_str = in_stack_ffffffffffffffa8;
    __y._M_len = in_stack_ffffffffffffffa0;
    bVar2 = std::operator==(__x,__y);
    if (!bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff98,
                 (char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      __x_00._M_str = in_RSI;
      __x_00._M_len = in_stack_ffffffffffffffb0;
      __y_00._M_str = in_stack_ffffffffffffffa8;
      __y_00._M_len = in_stack_ffffffffffffffa0;
      bVar2 = std::operator==(__x_00,__y_00);
      if (!bVar2) {
        std::
        map<std::__cxx11::string,BCLog::LogFlags,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>>
        ::find<std::basic_string_view<char,std::char_traits<char>>>
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
        ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>_>
               *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
        bVar2 = std::operator==(in_RDI,(_Self *)CONCAT17(in_stack_ffffffffffffff87,
                                                         in_stack_ffffffffffffff80));
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          bVar2 = false;
        }
        else {
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCLog::LogFlags>_>
                                 *)in_stack_ffffffffffffff78);
          in_RDI->_M_node = (_Base_ptr)ppVar3->second;
          bVar2 = true;
        }
        goto LAB_003ab496;
      }
    }
  }
  in_RDI->_M_node = (_Base_ptr)0xffffffffffffffff;
  bVar2 = true;
LAB_003ab496:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool GetLogCategory(BCLog::LogFlags& flag, std::string_view str)
{
    if (str.empty() || str == "1" || str == "all") {
        flag = BCLog::ALL;
        return true;
    }
    auto it = LOG_CATEGORIES_BY_STR.find(str);
    if (it != LOG_CATEGORIES_BY_STR.end()) {
        flag = it->second;
        return true;
    }
    return false;
}